

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall helics::apps::Connector::loadTextFile(Connector *this,string *filename)

{
  string_view delimiters;
  string_view line;
  string_view quoteChars;
  bool bVar1;
  undefined1 uVar2;
  AppTextParser *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq;
  iterator __end3;
  iterator __begin3;
  stringVector *__range3;
  stringVector blk;
  int lineNumber;
  string str;
  istringstream sstr;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  vector<int,_std::allocator<int>_> cnts;
  AppTextParser aparser;
  istream *in_stack_fffffffffffffae8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  App *in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffaf8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *lineNumber_00;
  AppTextParser *in_stack_fffffffffffffb10;
  AppTextParser *pAVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4b8;
  undefined1 *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  __sv_type local_480;
  undefined1 local_470 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbc0;
  Connector *in_stack_fffffffffffffbc8;
  istringstream local_430 [32];
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  AppTextParser *in_stack_fffffffffffffbf8;
  AppTextParser *in_stack_fffffffffffffc88;
  App *in_stack_fffffffffffffc90;
  Connector *in_stack_fffffffffffffd48;
  vector<int,_std::allocator<int>_> local_280;
  AppTextParser local_268;
  
  pAVar3 = &local_268;
  AppTextParser::AppTextParser(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x429087);
  AppTextParser::preParseFile(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffb00);
  AppTextParser::reset((AppTextParser *)in_stack_fffffffffffffaf0);
  this_00 = (AppTextParser *)AppTextParser::configString_abi_cxx11_(&local_268);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4290da);
  if (!bVar1) {
    App::loadConfigOptions(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    generateParser(in_stack_fffffffffffffd48);
    in_stack_fffffffffffffb10 = (AppTextParser *)AppTextParser::configString_abi_cxx11_(&local_268);
    std::__cxx11::istringstream::istringstream(local_430,(string *)in_stack_fffffffffffffb10,_S_in);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x429144);
    CLI::App::parse_from_stream(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::__cxx11::istringstream::~istringstream(local_430);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
                in_stack_fffffffffffffb00);
  }
  lineNumber_00 = &in_RDI[6].field_2;
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CLI::std::
            unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
            ::size((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
                    *)0x429213);
  CLI::std::vector<int,_std::allocator<int>_>::operator[](&local_280,0);
  CLI::std::
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
  ::reserve((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
             *)in_stack_fffffffffffffaf0,(size_type)in_stack_fffffffffffffae8);
  std::__cxx11::string::string(this_01);
  while( true ) {
    uVar2 = AppTextParser::loadNextLine
                      (this_00,(string *)in_stack_fffffffffffffb10,
                       (int *)lineNumber_00->_M_local_buf);
    if (!(bool)uVar2) break;
    local_480 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaf0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_01,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffaf8));
    local_4a8 = 3;
    uStack_4a0 = 0x80670e;
    this_02 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)3;
    in_stack_fffffffffffffaf0 = (App *)0x80670e;
    line._M_str = (char *)lineNumber_00;
    line._M_len = (size_t)this_01;
    delimiters._M_str._0_7_ = in_stack_fffffffffffffaf8;
    delimiters._M_len = 0x80670e;
    delimiters._M_str._7_1_ = uVar2;
    quoteChars._M_str = &pAVar3->mLineComment;
    quoteChars._M_len = (size_t)in_RDI;
    gmlc::utilities::stringOps::splitlineQuotes_abi_cxx11_(line,delimiters,quoteChars,on);
    local_4b0 = local_470;
    local_4b8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(this_02);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffaf0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)this_02);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_4b8);
      CLI::detail::remove_quotes(in_RDI);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_4b8);
    }
    addConnectionVector(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaf0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  AppTextParser::~AppTextParser((AppTextParser *)in_stack_fffffffffffffaf0);
  return;
}

Assistant:

void Connector::loadTextFile(const std::string& filename)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT
    AppTextParser aparser(filename);
    auto cnts = aparser.preParseFile({});

    aparser.reset();

    if (!aparser.configString().empty()) {
        App::loadConfigOptions(aparser);
        auto app = generateParser();
        std::istringstream sstr(aparser.configString());
        app->parse_from_stream(sstr);
    }
    connections.reserve(connections.size() + cnts[0]);
    std::string str;
    int lineNumber;
    while (aparser.loadNextLine(str, lineNumber)) {
        /* time key type value units*/
        auto blk = splitlineQuotes(str, ",\t ", default_quote_chars, delimiter_compression::on);
        for (auto& seq : blk) {
            CLI::detail::remove_quotes(seq);
        }
        addConnectionVector(blk);
    }
}